

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2polygon_layer.cc
# Opt level: O0

void __thiscall
s2builderutil::S2PolygonLayer::Init
          (S2PolygonLayer *this,S2Polygon *polygon,LabelSetIds *label_set_ids,
          IdSetLexicon *label_set_lexicon,Options *options)

{
  bool bVar1;
  ostream *poVar2;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  Options *local_30;
  Options *options_local;
  IdSetLexicon *label_set_lexicon_local;
  LabelSetIds *label_set_ids_local;
  S2Polygon *polygon_local;
  S2PolygonLayer *this_local;
  
  local_30 = options;
  options_local = (Options *)label_set_lexicon;
  label_set_lexicon_local = (IdSetLexicon *)label_set_ids;
  label_set_ids_local = (LabelSetIds *)polygon;
  polygon_local = (S2Polygon *)this;
  if ((label_set_ids == (LabelSetIds *)0x0) != (label_set_lexicon == (IdSetLexicon *)0x0)) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_s2polygon_layer.cc"
               ,0x39,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_48);
    poVar2 = std::operator<<(poVar2,
                             "Check failed: (label_set_ids == nullptr) == (label_set_lexicon == nullptr) "
                            );
    S2LogMessageVoidify::operator&(&local_31,poVar2);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
  }
  this->polygon_ = polygon;
  this->label_set_ids_ = label_set_ids;
  this->label_set_lexicon_ = label_set_lexicon;
  (this->options_).edge_type_ = options->edge_type_;
  (this->options_).validate_ = options->validate_;
  bVar1 = Options::validate(&this->options_);
  if (bVar1) {
    S2Polygon::set_s2debug_override(this->polygon_,DISABLE);
  }
  return;
}

Assistant:

void S2PolygonLayer::Init(
    S2Polygon* polygon, LabelSetIds* label_set_ids,
    IdSetLexicon* label_set_lexicon, const Options& options) {
  S2_DCHECK_EQ(label_set_ids == nullptr, label_set_lexicon == nullptr);
  polygon_ = polygon;
  label_set_ids_ = label_set_ids;
  label_set_lexicon_ = label_set_lexicon;
  options_ = options;

  if (options_.validate()) {
    polygon_->set_s2debug_override(S2Debug::DISABLE);
  }
}